

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_dart_struct_reader(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  pointer pptVar2;
  t_field *tfield;
  bool bVar3;
  ostream *poVar4;
  char *this_00;
  t_dart_generator *this_01;
  pointer pptVar5;
  string field_name;
  allocator local_281;
  t_struct *local_280;
  pointer local_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_280 = tstruct;
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar4,"read(TProtocol iprot)");
  std::__cxx11::string::string((string *)&local_1f0," ",(allocator *)&local_270);
  scope_up(this,out,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"TField field;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"iprot.readStructBegin();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar4,"while (true)");
  std::__cxx11::string::string((string *)&local_210," ",(allocator *)&local_270);
  scope_up(this,out,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"field = iprot.readFieldBegin();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar4,"if (field.type == TType.STOP)");
  std::__cxx11::string::string((string *)&local_230," ",(allocator *)&local_270);
  scope_up(this,out,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"break;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_150,(string *)&::endl_abi_cxx11_);
  scope_down(this,out,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar4,"switch (field.id)");
  std::__cxx11::string::string((string *)&local_250," ",(allocator *)&local_270);
  scope_up(this,out,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  pptVar5 = (local_280->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    pptVar2 = (local_280->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    poVar4 = t_generator::indent((t_generator *)this,out);
    if (pptVar5 == pptVar2) break;
    poVar4 = std::operator<<(poVar4,"case ");
    local_278 = pptVar5;
    std::__cxx11::string::string((string *)&local_170,(string *)&(*pptVar5)->name_);
    t_oop_generator::upcase_string(&local_270,&this->super_t_oop_generator,&local_170);
    poVar4 = std::operator<<(poVar4,(string *)&local_270);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_170);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent((t_generator *)this,out);
    this_00 = "if (field.type == ";
    poVar4 = std::operator<<(poVar4,"if (field.type == ");
    type_to_enum_abi_cxx11_(&local_270,(t_dart_generator *)this_00,(*local_278)->type_);
    poVar4 = std::operator<<(poVar4,(string *)&local_270);
    std::operator<<(poVar4,")");
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::string((string *)&local_70," ",(allocator *)&local_270);
    scope_up(this,out,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    tfield = *local_278;
    std::__cxx11::string::string((string *)&local_90,"this.",(allocator *)&local_270);
    generate_deserialize_field(this,out,tfield,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    generate_isset_set(this,out,*local_278);
    std::__cxx11::string::string((string *)&local_b0," else",(allocator *)&local_270);
    scope_down(this,out,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string((string *)&local_d0," ",(allocator *)&local_270);
    scope_up(this,out,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"TProtocolUtil.skip(iprot, field.type);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_f0,(string *)&::endl_abi_cxx11_);
    scope_down(this,out,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"break;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    pptVar5 = local_278 + 1;
  }
  poVar4 = std::operator<<(poVar4,"default:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"TProtocolUtil.skip(iprot, field.type);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"break;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::string::string((string *)&local_190,(string *)&::endl_abi_cxx11_);
  scope_down(this,out,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"iprot.readFieldEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_1b0,(string *)&::endl_abi_cxx11_);
  scope_down(this,out,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"iprot.readStructEnd();");
  std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,
                           "// check for required fields of primitive type, which can\'t be checked in the validate method"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  for (pptVar5 = (local_280->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (local_280->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    if ((*pptVar5)->req_ == T_REQUIRED) {
      bVar3 = type_can_be_null(this,(*pptVar5)->type_);
      if (!bVar3) {
        this_01 = (t_dart_generator *)&(*pptVar5)->name_;
        std::__cxx11::string::string((string *)&local_50,(string *)this_01);
        get_member_name(&local_270,this_01,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"if (!__isset_");
        poVar4 = std::operator<<(poVar4,(string *)&local_270);
        std::operator<<(poVar4,")");
        std::__cxx11::string::string((string *)&local_110," ",&local_281);
        scope_up(this,out,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,
                                 "  throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field \'"
                                );
        poVar4 = std::operator<<(poVar4,(string *)&local_270);
        poVar4 = std::operator<<(poVar4,
                                 "\' was not found in serialized data! Struct: \" + toString());");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::string((string *)&local_130,(string *)&endl2_abi_cxx11_);
        scope_down(this,out,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_270);
      }
    }
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"validate();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&endl2_abi_cxx11_);
  scope_down(this,out,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct_reader(ostream& out, t_struct* tstruct) {
  indent(out) << "read(TProtocol iprot)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Declare stack tmp variables and read struct header
  indent(out) << "TField field;" << endl;
  indent(out) << "iprot.readStructBegin();" << endl;

  // Loop over reading in fields
  indent(out) << "while (true)";
  scope_up(out);

  // Read beginning field marker
  indent(out) << "field = iprot.readFieldBegin();" << endl;

  // Check for field STOP marker and break
  indent(out) << "if (field.type == TType.STOP)";
  scope_up(out);
  indent(out) << "break;" << endl;
  scope_down(out);

  // Switch statement on the field we are reading
  indent(out) << "switch (field.id)";
  scope_up(out);

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << upcase_string((*f_iter)->get_name()) << ":" << endl;
    indent_up();

    indent(out) << "if (field.type == " << type_to_enum((*f_iter)->get_type()) << ")";
    scope_up(out);

    generate_deserialize_field(out, *f_iter, "this.");
    generate_isset_set(out, *f_iter);

    scope_down(out, " else");
    scope_up(out);
    indent(out) << "TProtocolUtil.skip(iprot, field.type);" << endl;
    scope_down(out);

    indent(out) << "break;" << endl;
    indent_down();
  }

  // In the default case we skip the field
  indent(out) << "default:" << endl;
  indent_up();
  indent(out) << "TProtocolUtil.skip(iprot, field.type);" << endl;
  indent(out) << "break;" << endl;
  indent_down();

  scope_down(out);

  // Read field end marker
  indent(out) << "iprot.readFieldEnd();" << endl;

  scope_down(out);

  indent(out) << "iprot.readStructEnd();" << endl2;

  // in non-beans style, check for required fields of primitive type
  // (which can be checked here but not in the general validate method)
  indent(out) << "// check for required fields of primitive type, which can't be "
                 "checked in the validate method" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED && !type_can_be_null((*f_iter)->get_type())) {
      string field_name = get_member_name((*f_iter)->get_name());
      indent(out) << "if (!__isset_" << field_name << ")";
      scope_up(out);
      indent(out) << "  throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field '"
          << field_name
          << "' was not found in serialized data! Struct: \" + toString());" << endl;
      scope_down(out, endl2);
    }
  }

  // performs various checks (e.g. check that all required fields are set)
  indent(out) << "validate();" << endl;

  scope_down(out, endl2);
}